

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

void __thiscall wallet::LegacyScriptPubKeyMan::MarkPreSplitKeys(LegacyScriptPubKeyMan *this)

{
  bool bVar1;
  undefined1 uVar2;
  reference plVar3;
  runtime_error *prVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<long>,_bool> pVar5;
  int64_t index;
  iterator it;
  WalletBatch batch;
  CKeyPool keypool;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  iterator in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  const_iterator in_stack_fffffffffffffe80;
  CKeyPool *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  int64_t in_stack_fffffffffffffea0;
  allocator<char> *in_stack_fffffffffffffea8;
  allocator<char> *__a;
  undefined7 in_stack_fffffffffffffeb0;
  allocator<char> local_111;
  long local_110;
  _Base_ptr local_108;
  _Base_ptr local_100;
  _Base_ptr local_e8;
  undefined1 local_e0;
  string local_b8 [64];
  string local_78 [106];
  undefined1 local_e;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (**(code **)(*(long *)in_RDI->_M_string_length + 0x18))();
  WalletBatch::WalletBatch
            ((WalletBatch *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
             (WalletDatabase *)in_stack_fffffffffffffe70._M_node,(bool)in_stack_fffffffffffffe6f);
  local_100 = (_Base_ptr)
              std::set<long,_std::less<long>,_std::allocator<long>_>::begin
                        (in_stack_fffffffffffffe70._M_node);
  do {
    local_108 = (_Base_ptr)
                std::set<long,_std::less<long>,_std::allocator<long>_>::end
                          (in_stack_fffffffffffffe70._M_node);
    bVar1 = std::operator==((_Self *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                            (_Self *)in_stack_fffffffffffffe70._M_node);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      WalletBatch::~WalletBatch
                ((WalletBatch *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
LAB_0166b786:
      __stack_chk_fail();
    }
    plVar3 = std::_Rb_tree_const_iterator<long>::operator*
                       ((_Rb_tree_const_iterator<long> *)
                        CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
    local_110 = *plVar3;
    CKeyPool::CKeyPool((CKeyPool *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
    uVar2 = WalletBatch::ReadPool
                      ((WalletBatch *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                       in_stack_fffffffffffffea0,in_stack_fffffffffffffe90);
    if (!(bool)uVar2) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      __a = &local_111;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_RDI,(char *)CONCAT17(uVar2,in_stack_fffffffffffffeb0),__a);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe80._M_node,
                     (char *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
      std::runtime_error::runtime_error(prVar4,local_78);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0166b786;
    }
    local_e = 1;
    in_stack_fffffffffffffe9f =
         WalletBatch::WritePool
                   ((WalletBatch *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                    in_stack_fffffffffffffea0,in_stack_fffffffffffffe90);
    if (!(bool)in_stack_fffffffffffffe9f) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_RDI,(char *)CONCAT17(uVar2,in_stack_fffffffffffffeb0),in_stack_fffffffffffffea8)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe80._M_node,
                     (char *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
      std::runtime_error::runtime_error(prVar4,local_b8);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0166b786;
    }
    pVar5 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                      ((set<long,_std::less<long>,_std::allocator<long>_> *)
                       CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                       (value_type_conflict6 *)in_stack_fffffffffffffe70._M_node);
    in_stack_fffffffffffffe80._M_node = (_Base_ptr)pVar5.first._M_node;
    in_stack_fffffffffffffe7f = pVar5.second;
    local_e8 = in_stack_fffffffffffffe80._M_node;
    local_e0 = in_stack_fffffffffffffe7f;
    in_stack_fffffffffffffe70 =
         std::set<long,std::less<long>,std::allocator<long>>::erase_abi_cxx11_
                   ((set<long,_std::less<long>,_std::allocator<long>_> *)
                    CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                    in_stack_fffffffffffffe80);
    local_100 = in_stack_fffffffffffffe70._M_node;
  } while( true );
}

Assistant:

void LegacyScriptPubKeyMan::MarkPreSplitKeys()
{
    WalletBatch batch(m_storage.GetDatabase());
    for (auto it = setExternalKeyPool.begin(); it != setExternalKeyPool.end();) {
        int64_t index = *it;
        CKeyPool keypool;
        if (!batch.ReadPool(index, keypool)) {
            throw std::runtime_error(std::string(__func__) + ": read keypool entry failed");
        }
        keypool.m_pre_split = true;
        if (!batch.WritePool(index, keypool)) {
            throw std::runtime_error(std::string(__func__) + ": writing modified keypool entry failed");
        }
        set_pre_split_keypool.insert(index);
        it = setExternalKeyPool.erase(it);
    }
}